

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-a32.inc.c
# Opt level: O0

void disas_a32_extract_ldst_ri12_p1w(DisasContext_conflict1 *ctx,arg_ldst_ri *a,uint32_t insn)

{
  uint32_t uVar1;
  uint32_t insn_local;
  arg_ldst_ri *a_local;
  DisasContext_conflict1 *ctx_local;
  
  uVar1 = extract32(insn,0x17,1);
  a->u = uVar1;
  uVar1 = extract32(insn,0x15,1);
  a->w = uVar1;
  uVar1 = extract32(insn,0x10,4);
  a->rn = uVar1;
  uVar1 = extract32(insn,0xc,4);
  a->rt = uVar1;
  uVar1 = extract32(insn,0,0xc);
  a->imm = uVar1;
  a->p = 1;
  return;
}

Assistant:

static void disas_a32_extract_ldst_ri12_p1w(DisasContext *ctx, arg_ldst_ri *a, uint32_t insn)
{
    a->u = extract32(insn, 23, 1);
    a->w = extract32(insn, 21, 1);
    a->rn = extract32(insn, 16, 4);
    a->rt = extract32(insn, 12, 4);
    a->imm = extract32(insn, 0, 12);
    a->p = 1;
}